

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O2

float dtl_sv_to_flt(dtl_sv_t *self,_Bool *ok)

{
  _Bool _Var1;
  ulong uVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (self == (dtl_sv_t *)0x0) {
switchD_00104a04_default:
    _Var1 = false;
  }
  else {
    switch(self->u32Flags >> 4 & 0xf) {
    case 1:
      fVar3 = (float)(self->pAny->val).i32;
      break;
    case 2:
      uVar2 = (ulong)(self->pAny->val).u32;
LAB_00104a5f:
      fVar3 = (float)(long)uVar2;
      break;
    case 3:
      fVar3 = (float)(self->pAny->val).i64;
      break;
    case 4:
      uVar2 = (self->pAny->val).i64;
      if (-1 < (long)uVar2) goto LAB_00104a5f;
      fVar3 = (float)uVar2;
      break;
    case 5:
      fVar3 = (float)(self->pAny->val).i32;
      break;
    case 6:
      fVar3 = (float)(self->pAny->val).dbl;
      break;
    case 7:
    case 8:
      fVar3 = (float)(int)(self->pAny->val).cr;
      break;
    default:
      goto switchD_00104a04_default;
    }
    _Var1 = true;
  }
  if (ok != (_Bool *)0x0) {
    *ok = _Var1;
  }
  return fVar3;
}

Assistant:

float dtl_sv_to_flt(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   float retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (float) self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (float) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (float) self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         retval = (float) self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_FLT:
         retval = self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = (float) self->pAny->val.dbl;
         success = true;
         break;
      case DTL_SV_BOOL:
         retval = (float) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (float)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}